

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void twitter::zipkin::thrift::swap(Span *a,Span *b)

{
  Span *b_local;
  Span *a_local;
  
  std::swap<long>(&a->trace_id,&b->trace_id);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&a->name,&b->name);
  std::swap<long>(&a->id,&b->id);
  std::swap<long>(&a->parent_id,&b->parent_id);
  std::swap<twitter::zipkin::thrift::Annotation,std::allocator<twitter::zipkin::thrift::Annotation>>
            (&a->annotations,&b->annotations);
  std::
  swap<twitter::zipkin::thrift::BinaryAnnotation,std::allocator<twitter::zipkin::thrift::BinaryAnnotation>>
            (&a->binary_annotations,&b->binary_annotations);
  std::swap<bool>(&a->debug,&b->debug);
  std::swap<long>(&a->timestamp,&b->timestamp);
  std::swap<long>(&a->duration,&b->duration);
  std::swap<long>(&a->trace_id_high,&b->trace_id_high);
  std::swap<twitter::zipkin::thrift::_Span__isset>(&a->__isset,&b->__isset);
  return;
}

Assistant:

void swap(Span &a, Span &b) {
  using ::std::swap;
  swap(a.trace_id, b.trace_id);
  swap(a.name, b.name);
  swap(a.id, b.id);
  swap(a.parent_id, b.parent_id);
  swap(a.annotations, b.annotations);
  swap(a.binary_annotations, b.binary_annotations);
  swap(a.debug, b.debug);
  swap(a.timestamp, b.timestamp);
  swap(a.duration, b.duration);
  swap(a.trace_id_high, b.trace_id_high);
  swap(a.__isset, b.__isset);
}